

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void store_storefile(png_store *ps,png_uint_32 id)

{
  png_uint_32 pVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  png_store_file *ppVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  if ((((pm.this.chunkpos != 0) || (pm.this.chunktype != 0)) || (pm.this.chunklen != 0)) ||
     (pVar1 = pm.this.IDAT_size, pm.this.IDAT_size == 0)) {
    png_error(pm.this.pwrite,"storefile: incomplete write");
  }
  ppVar5 = (png_store_file *)malloc(0x270);
  if (ppVar5 == (png_store_file *)0x0) {
    png_error(pm.this.pwrite,"storefile: OOM");
  }
  if (pm.this.wname[0] == '\0') {
    uVar6 = 0;
  }
  else {
    uVar9 = 0;
    cVar2 = pm.this.wname[0];
    do {
      uVar8 = uVar9;
      ppVar5->name[uVar8] = cVar2;
      if (uVar8 == 0x3f) {
        uVar9 = 0x40;
        break;
      }
      cVar2 = pm.this.wname[uVar8 + 1];
      uVar9 = uVar8 + 1;
    } while (cVar2 != '\0');
    uVar6 = 0x3f;
    if (uVar8 < 0x3f) {
      uVar6 = uVar9;
    }
  }
  ppVar5->name[uVar6] = '\0';
  ppVar5->id = (png_uint_32)ps;
  memcpy(&ppVar5->data,&pm.this.new,0x200);
  ppVar5->datacount = pm.this.writepos;
  ppVar5->IDAT_size = pVar1;
  uVar10 = pVar1 >> 0x10;
  if (0xffff >= pVar1) {
    uVar10 = pVar1;
  }
  uVar7 = (uint)(0xffff < pVar1) * 0x10;
  uVar4 = uVar10 >> 8;
  if (uVar10 < 0x100) {
    uVar4 = uVar10;
  }
  uVar3 = uVar7 + 8;
  if (uVar10 < 0x100) {
    uVar3 = uVar7;
  }
  uVar10 = uVar4 >> 4;
  if (uVar4 < 0x10) {
    uVar10 = uVar4;
  }
  uVar7 = uVar3 + 4;
  if (uVar4 < 0x10) {
    uVar7 = uVar3;
  }
  uVar4 = uVar10 >> 2;
  if (uVar10 < 4) {
    uVar4 = uVar10;
  }
  uVar3 = uVar7 + 2;
  if (uVar10 < 4) {
    uVar3 = uVar7;
  }
  uVar10 = uVar3 + 1 + (uint)((uVar4 >> 1 & 1) != 0);
  if (uVar4 == 0) {
    uVar10 = uVar3;
  }
  ppVar5->IDAT_bits = uVar10;
  if (uVar10 == 0) {
    png_error(pm.this.pwrite,"storefile: 0 sized IDAT");
  }
  pm.this.new.prev = (png_store_buffer *)0x0;
  pm.this.writepos = 0;
  pm.this.chunkpos = 8;
  pm.this.IDAT_size = 0;
  pm.this.chunklen = 0x10;
  pm.this.chunktype = 0;
  ppVar5->palette = pm.this.palette;
  ppVar5->npalette = pm.this.npalette;
  pm.this.palette = (store_palette_entry *)0x0;
  pm.this.npalette = 0;
  ppVar5->next = pm.this.saved;
  pm.this.saved = ppVar5;
  return;
}

Assistant:

static void
store_storefile(png_store *ps, png_uint_32 id)
{
   png_store_file *pf;

   if (ps->chunkpos != 0U || ps->chunktype != 0U || ps->chunklen != 0U ||
       ps->IDAT_size == 0)
      png_error(ps->pwrite, "storefile: incomplete write");

   pf = voidcast(png_store_file*, malloc(sizeof *pf));
   if (pf == NULL)
      png_error(ps->pwrite, "storefile: OOM");
   safecat(pf->name, sizeof pf->name, 0, ps->wname);
   pf->id = id;
   pf->data = ps->new;
   pf->datacount = ps->writepos;
   pf->IDAT_size = ps->IDAT_size;
   pf->IDAT_bits = bits_of(ps->IDAT_size);
   /* Because the IDAT always has zlib header stuff this must be true: */
   if (pf->IDAT_bits == 0U)
      png_error(ps->pwrite, "storefile: 0 sized IDAT");
   ps->new.prev = NULL;
   ps->writepos = 0;
   ps->chunkpos = 8;
   ps->chunktype = 0;
   ps->chunklen = 16;
   ps->IDAT_size = 0;
   pf->palette = ps->palette;
   pf->npalette = ps->npalette;
   ps->palette = 0;
   ps->npalette = 0;

   /* And save it. */
   pf->next = ps->saved;
   ps->saved = pf;
}